

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

sock_address_any * __thiscall
sockpp::socket::address(sock_address_any *__return_storage_ptr__,socket *this)

{
  int iVar1;
  int *piVar2;
  socklen_t len;
  sockaddr_storage addrStore;
  socklen_t local_8c;
  sockaddr_storage local_88;
  
  local_88.__ss_padding[0x6e] = '\0';
  local_88.__ss_padding[0x6f] = '\0';
  local_88.__ss_padding[0x70] = '\0';
  local_88.__ss_padding[0x71] = '\0';
  local_88.__ss_padding[0x72] = '\0';
  local_88.__ss_padding[0x73] = '\0';
  local_88.__ss_padding[0x74] = '\0';
  local_88.__ss_padding[0x75] = '\0';
  local_88.__ss_align = 0;
  local_88.__ss_padding[0x5e] = '\0';
  local_88.__ss_padding[0x5f] = '\0';
  local_88.__ss_padding[0x60] = '\0';
  local_88.__ss_padding[0x61] = '\0';
  local_88.__ss_padding[0x62] = '\0';
  local_88.__ss_padding[99] = '\0';
  local_88.__ss_padding[100] = '\0';
  local_88.__ss_padding[0x65] = '\0';
  local_88.__ss_padding[0x66] = '\0';
  local_88.__ss_padding[0x67] = '\0';
  local_88.__ss_padding[0x68] = '\0';
  local_88.__ss_padding[0x69] = '\0';
  local_88.__ss_padding[0x6a] = '\0';
  local_88.__ss_padding[0x6b] = '\0';
  local_88.__ss_padding[0x6c] = '\0';
  local_88.__ss_padding[0x6d] = '\0';
  local_88.__ss_padding[0x4e] = '\0';
  local_88.__ss_padding[0x4f] = '\0';
  local_88.__ss_padding[0x50] = '\0';
  local_88.__ss_padding[0x51] = '\0';
  local_88.__ss_padding[0x52] = '\0';
  local_88.__ss_padding[0x53] = '\0';
  local_88.__ss_padding[0x54] = '\0';
  local_88.__ss_padding[0x55] = '\0';
  local_88.__ss_padding[0x56] = '\0';
  local_88.__ss_padding[0x57] = '\0';
  local_88.__ss_padding[0x58] = '\0';
  local_88.__ss_padding[0x59] = '\0';
  local_88.__ss_padding[0x5a] = '\0';
  local_88.__ss_padding[0x5b] = '\0';
  local_88.__ss_padding[0x5c] = '\0';
  local_88.__ss_padding[0x5d] = '\0';
  local_88.__ss_padding[0x3e] = '\0';
  local_88.__ss_padding[0x3f] = '\0';
  local_88.__ss_padding[0x40] = '\0';
  local_88.__ss_padding[0x41] = '\0';
  local_88.__ss_padding[0x42] = '\0';
  local_88.__ss_padding[0x43] = '\0';
  local_88.__ss_padding[0x44] = '\0';
  local_88.__ss_padding[0x45] = '\0';
  local_88.__ss_padding[0x46] = '\0';
  local_88.__ss_padding[0x47] = '\0';
  local_88.__ss_padding[0x48] = '\0';
  local_88.__ss_padding[0x49] = '\0';
  local_88.__ss_padding[0x4a] = '\0';
  local_88.__ss_padding[0x4b] = '\0';
  local_88.__ss_padding[0x4c] = '\0';
  local_88.__ss_padding[0x4d] = '\0';
  local_88.__ss_padding[0x2e] = '\0';
  local_88.__ss_padding[0x2f] = '\0';
  local_88.__ss_padding[0x30] = '\0';
  local_88.__ss_padding[0x31] = '\0';
  local_88.__ss_padding[0x32] = '\0';
  local_88.__ss_padding[0x33] = '\0';
  local_88.__ss_padding[0x34] = '\0';
  local_88.__ss_padding[0x35] = '\0';
  local_88.__ss_padding[0x36] = '\0';
  local_88.__ss_padding[0x37] = '\0';
  local_88.__ss_padding[0x38] = '\0';
  local_88.__ss_padding[0x39] = '\0';
  local_88.__ss_padding[0x3a] = '\0';
  local_88.__ss_padding[0x3b] = '\0';
  local_88.__ss_padding[0x3c] = '\0';
  local_88.__ss_padding[0x3d] = '\0';
  local_88.__ss_padding[0x1e] = '\0';
  local_88.__ss_padding[0x1f] = '\0';
  local_88.__ss_padding[0x20] = '\0';
  local_88.__ss_padding[0x21] = '\0';
  local_88.__ss_padding[0x22] = '\0';
  local_88.__ss_padding[0x23] = '\0';
  local_88.__ss_padding[0x24] = '\0';
  local_88.__ss_padding[0x25] = '\0';
  local_88.__ss_padding[0x26] = '\0';
  local_88.__ss_padding[0x27] = '\0';
  local_88.__ss_padding[0x28] = '\0';
  local_88.__ss_padding[0x29] = '\0';
  local_88.__ss_padding[0x2a] = '\0';
  local_88.__ss_padding[0x2b] = '\0';
  local_88.__ss_padding[0x2c] = '\0';
  local_88.__ss_padding[0x2d] = '\0';
  local_88.__ss_padding[0xe] = '\0';
  local_88.__ss_padding[0xf] = '\0';
  local_88.__ss_padding[0x10] = '\0';
  local_88.__ss_padding[0x11] = '\0';
  local_88.__ss_padding[0x12] = '\0';
  local_88.__ss_padding[0x13] = '\0';
  local_88.__ss_padding[0x14] = '\0';
  local_88.__ss_padding[0x15] = '\0';
  local_88.__ss_padding[0x16] = '\0';
  local_88.__ss_padding[0x17] = '\0';
  local_88.__ss_padding[0x18] = '\0';
  local_88.__ss_padding[0x19] = '\0';
  local_88.__ss_padding[0x1a] = '\0';
  local_88.__ss_padding[0x1b] = '\0';
  local_88.__ss_padding[0x1c] = '\0';
  local_88.__ss_padding[0x1d] = '\0';
  local_88.ss_family = 0;
  local_88.__ss_padding[0] = '\0';
  local_88.__ss_padding[1] = '\0';
  local_88.__ss_padding[2] = '\0';
  local_88.__ss_padding[3] = '\0';
  local_88.__ss_padding[4] = '\0';
  local_88.__ss_padding[5] = '\0';
  local_88.__ss_padding[6] = '\0';
  local_88.__ss_padding[7] = '\0';
  local_88.__ss_padding[8] = '\0';
  local_88.__ss_padding[9] = '\0';
  local_88.__ss_padding[10] = '\0';
  local_88.__ss_padding[0xb] = '\0';
  local_88.__ss_padding[0xc] = '\0';
  local_88.__ss_padding[0xd] = '\0';
  local_8c = 0x80;
  iVar1 = getsockname(this->handle_,(sockaddr *)&local_88,&local_8c);
  if ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 != 0)) {
    *(undefined8 *)&__return_storage_ptr__->sz_ = 0;
    (__return_storage_ptr__->super_sock_address)._vptr_sock_address =
         (_func_int **)&PTR__sock_address_0010bbf0;
    (__return_storage_ptr__->addr_).ss_family = 0;
    (__return_storage_ptr__->addr_).__ss_padding[0] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[1] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[2] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[3] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[4] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[5] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[6] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[7] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[8] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[9] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[10] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0xb] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0xc] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0xd] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0xe] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0xf] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x10] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x11] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x12] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x13] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x14] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x15] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x16] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x17] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x18] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x19] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x1f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x20] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x21] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x22] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x23] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x24] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x25] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x26] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x27] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x28] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x29] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x2f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x30] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x31] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x32] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x33] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x34] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x35] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x36] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x37] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x38] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x39] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x3f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x40] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x41] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x42] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x43] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x44] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x45] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x46] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x47] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x48] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x49] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x4f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x50] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x51] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x52] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x53] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x54] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x55] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x56] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x57] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x58] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x59] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x5f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x60] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x61] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x62] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[99] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[100] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x65] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x66] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x67] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x68] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x69] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6a] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6b] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6c] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6d] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6e] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x6f] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x70] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x71] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x72] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x73] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x74] = '\0';
    (__return_storage_ptr__->addr_).__ss_padding[0x75] = '\0';
    (__return_storage_ptr__->addr_).__ss_align = 0;
    __return_storage_ptr__->sz_ = 0x80;
    return __return_storage_ptr__;
  }
  sock_address_any::sock_address_any(__return_storage_ptr__,&local_88,local_8c);
  return __return_storage_ptr__;
}

Assistant:

sock_address_any socket::address() const {
    auto addrStore = sockaddr_storage{};
    socklen_t len = sizeof(sockaddr_storage);

    // TODO: Return the result
    auto res =
        check_res(::getsockname(handle_, reinterpret_cast<sockaddr*>(&addrStore), &len));
    if (!res)
        return sock_address_any{};

    return sock_address_any(addrStore, len);
}